

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O2

TestCaseGroup * vkt::geometry::createLayeredRenderingTests(TestContext *testCtx)

{
  undefined4 uVar1;
  TestContext *testCtx_00;
  undefined8 uVar2;
  TestCaseGroup *pTVar3;
  char *__s;
  TestNode *node;
  long lVar4;
  long lVar5;
  allocator<char> local_d1;
  undefined8 *local_d0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> viewTypeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string local_90;
  string local_70;
  string s;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"layered","Layered rendering tests.");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar3;
  for (lVar5 = 0;
      pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, lVar5 != 5; lVar5 = lVar5 + 1) {
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    local_d0 = (undefined8 *)(lVar5 * 0x14);
    __s = ::vk::getImageViewTypeName((&DAT_009e6de0)[lVar5 * 5]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,__s,(allocator<char> *)&local_70);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&s);
    de::toLower(&local_90,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&s);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,local_90._M_dataplus._M_p,"");
    local_d0 = (undefined8 *)((long)&DAT_009e6de0 + (long)local_d0);
    viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar3;
    std::__cxx11::string::~string((string *)&local_90);
    for (lVar4 = 0x10;
        pTVar3 = viewTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar4 != 0xb8; lVar4 = lVar4 + 0x18) {
      uVar1 = *(undefined4 *)((long)&PTR_typeinfo_00bf54a0 + lVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,*(char **)(&UNK_00bf54a8 + lVar4),(allocator<char> *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,*(char **)((long)&DAT_00bf54b0 + lVar4),&local_d1);
      testCtx_00 = (pTVar3->super_TestNode).m_testCtx;
      node = (TestNode *)operator_new(0x98);
      TestCase::TestCase((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,&s,&local_70);
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bf5568;
      node[1]._vptr_TestNode = (_func_int **)anon_unknown_0::initPrograms;
      node[1].m_testCtx = (TestContext *)anon_unknown_0::test;
      *(undefined4 *)&node[1].m_name._M_dataplus._M_p = uVar1;
      uVar2 = local_d0[1];
      *(undefined8 *)((long)&node[1].m_name._M_dataplus._M_p + 4) = *local_d0;
      *(undefined8 *)((long)&node[1].m_name._M_string_length + 4) = uVar2;
      *(undefined4 *)((long)&node[1].m_name.field_2 + 4) = *(undefined4 *)(local_d0 + 2);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,node);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&s);
    }
    viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&viewTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createLayeredRenderingTests (tcu::TestContext& testCtx)
{
	MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "layered", "Layered rendering tests."));

	const struct
	{
		TestType		test;
		const char*		name;
		const char*		description;
	} testTypes[] =
	{
		{ TEST_TYPE_DEFAULT_LAYER,					"render_to_default_layer",			"Render to the default layer"															},
		{ TEST_TYPE_SINGLE_LAYER,					"render_to_one",					"Render to one layer"																	},
		{ TEST_TYPE_ALL_LAYERS,						"render_to_all",					"Render to all layers"																	},
		{ TEST_TYPE_DIFFERENT_CONTENT,				"render_different_content",			"Render different data to different layers"												},
		{ TEST_TYPE_LAYER_ID,						"fragment_layer",					"Read gl_Layer in fragment shader"														},
		{ TEST_TYPE_INVOCATION_PER_LAYER,			"invocation_per_layer",				"Render to multiple layers with multiple invocations, one invocation per layer"			},
		{ TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION,	"multiple_layers_per_invocation",	"Render to multiple layers with multiple invocations, multiple layers per invocation",	},
	};

	const ImageParams imageParams[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		{ 64,  1, 1 },	4	},
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		{ 64, 64, 1 },	4	},
		{ VK_IMAGE_VIEW_TYPE_CUBE,			{ 64, 64, 1 },	6	},
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	{ 64, 64, 1 },	2*6	},
		{ VK_IMAGE_VIEW_TYPE_3D,			{ 64, 64, 8 },	1	}
	};

	for (int imageParamNdx = 0; imageParamNdx < DE_LENGTH_OF_ARRAY(imageParams); ++imageParamNdx)
	{
		MovePtr<tcu::TestCaseGroup> viewTypeGroup(new tcu::TestCaseGroup(testCtx, getShortImageViewTypeName(imageParams[imageParamNdx].viewType).c_str(), ""));

		for (int testTypeNdx = 0; testTypeNdx < DE_LENGTH_OF_ARRAY(testTypes); ++testTypeNdx)
		{
			const TestParams params =
			{
				testTypes[testTypeNdx].test,
				imageParams[imageParamNdx],
			};
			addFunctionCaseWithPrograms(viewTypeGroup.get(), testTypes[testTypeNdx].name, testTypes[testTypeNdx].description, initPrograms, test, params);
		}

		group->addChild(viewTypeGroup.release());
	}

	return group.release();
}